

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32 field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  bool bVar1;
  Limit LVar2;
  int iVar3;
  ulong uVar4;
  CodedInputStream *in_RCX;
  CodedInputStream *in_RDX;
  undefined4 in_ESI;
  CodedInputStream *in_R8;
  int value;
  Limit limit;
  uint32 length;
  uint32 temp;
  Limit in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd0;
  bool local_1d;
  Limit local_1c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(in_RDX,(uint32 *)in_RCX);
  if (bVar1) {
    LVar2 = io::CodedInputStream::PushLimit(in_RCX,(int)((ulong)in_R8 >> 0x20));
    while (iVar3 = io::CodedInputStream::BytesUntilLimit(in_R8), 0 < iVar3) {
      bVar1 = io::CodedInputStream::ReadVarint32(in_RDX,(uint32 *)in_RCX);
      if (!bVar1) {
        return false;
      }
      in_stack_ffffffffffffffac = local_1c;
      if ((in_RDX == (CodedInputStream *)0x0) ||
         (uVar4 = (*(code *)in_RDX)(local_1c), (uVar4 & 1) != 0)) {
        RepeatedField<int>::Add((RepeatedField<int> *)in_RCX,(int *)in_R8);
      }
      else {
        UnknownFieldSet::AddVarint
                  ((UnknownFieldSet *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                   (int)((ulong)in_RDX >> 0x20),(uint64)in_RCX);
      }
    }
    io::CodedInputStream::PopLimit
              ((CodedInputStream *)CONCAT44(in_stack_ffffffffffffffb4,LVar2),
               in_stack_ffffffffffffffac);
    local_1d = true;
  }
  else {
    local_1d = false;
  }
  return local_1d;
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32 field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
            input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}